

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadPolH_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_> *this_00;
  char cVar1;
  Node *msh;
  long lVar2;
  _func_int **pp_Var3;
  _Elt_pointer ppNVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  Mesh *this_01;
  _Elt_pointer psVar9;
  LineSplitter *splitter_00;
  char *pcVar10;
  LineSplitter *pLVar11;
  Logger *this_02;
  ChunkInfo *pCVar12;
  uint cur;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ai_real aVar16;
  allocator<char> local_99;
  char *s_1;
  undefined1 auStack_90 [24];
  char *s;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  uint local_64;
  Node *local_60;
  iterator *local_58;
  Node *local_50;
  Type *local_48;
  ChunkInfo *local_40;
  ulong local_38;
  
  if (8 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"PolH");
    return;
  }
  pCVar12 = nfo;
  this_01 = (Mesh *)operator_new(0x158);
  COB::Mesh::Mesh(this_01);
  std::__shared_ptr<Assimp::COB::Mesh,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::COB::Mesh,void>
            ((__shared_ptr<Assimp::COB::Mesh,(__gnu_cxx::_Lock_policy)2> *)&s,this_01);
  s_1 = s;
  auStack_90._0_8_ = _Stack_70._M_pi;
  s = (char *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,(shared_ptr<Assimp::COB::Node> *)&s_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  psVar9 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar9 == (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar12 = (ChunkInfo *)
              (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar9 = (_Elt_pointer)(*(long *)&pCVar12[-1].version + 0x200);
  }
  msh = psVar9[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar8 = nfo->parent_id;
  uVar5 = nfo->version;
  uVar6 = nfo->size;
  (msh->super_ChunkInfo).id = nfo->id;
  (msh->super_ChunkInfo).parent_id = uVar8;
  (msh->super_ChunkInfo).version = uVar5;
  (msh->super_ChunkInfo).size = uVar6;
  pLVar11 = splitter;
  local_40 = nfo;
  splitter_00 = LineSplitter::operator++(splitter);
  ReadBasicNodeInfo_Ascii((COBImporter *)pLVar11,msh,splitter_00,pCVar12);
  local_58 = &msh[1].temp_children.
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start;
  local_50 = msh + 1;
  local_48 = &msh[1].type;
  local_60 = msh;
  do {
    if (*(int *)&splitter->mStream->end == *(int *)&splitter->mStream->current) {
      return;
    }
    bVar7 = LineSplitter::match_start(splitter,"World Vertices");
    if (bVar7) {
      pcVar10 = LineSplitter::operator[](splitter,2);
      uVar8 = strtoul10(pcVar10,(char **)0x0);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_48,
                 (ulong)uVar8);
      lVar14 = 0;
      while (((ulong)uVar8 * 0xc - lVar14 != 0 &&
             (pLVar11 = LineSplitter::operator++(splitter),
             *(int *)&pLVar11->mStream->end != *(int *)&pLVar11->mStream->current))) {
        s_1 = (splitter->mCur)._M_dataplus._M_p;
        lVar2 = *(long *)local_48;
        SkipSpaces<char>(&s_1);
        aVar16 = fast_atof(&s_1);
        *(ai_real *)(lVar2 + lVar14) = aVar16;
        SkipSpaces<char>(&s_1);
        aVar16 = fast_atof(&s_1);
        *(ai_real *)(lVar2 + 4 + lVar14) = aVar16;
        SkipSpaces<char>(&s_1);
        aVar16 = fast_atof(&s_1);
        *(ai_real *)(lVar2 + 8 + lVar14) = aVar16;
        lVar14 = lVar14 + 0xc;
      }
    }
    else {
      bVar7 = LineSplitter::match_start(splitter,"Texture Vertices");
      if (bVar7) {
        pcVar10 = LineSplitter::operator[](splitter,2);
        uVar8 = strtoul10(pcVar10,(char **)0x0);
        std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                  ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)local_50,
                   (ulong)uVar8);
        uVar13 = 0;
        while ((uVar8 != uVar13 &&
               (pLVar11 = LineSplitter::operator++(splitter),
               *(int *)&pLVar11->mStream->end != *(int *)&pLVar11->mStream->current))) {
          s_1 = (splitter->mCur)._M_dataplus._M_p;
          pp_Var3 = local_50->_vptr_Node;
          SkipSpaces<char>(&s_1);
          aVar16 = fast_atof(&s_1);
          *(ai_real *)(pp_Var3 + uVar13) = aVar16;
          SkipSpaces<char>(&s_1);
          aVar16 = fast_atof(&s_1);
          *(ai_real *)((long)pp_Var3 + uVar13 * 8 + 4) = aVar16;
          uVar13 = uVar13 + 1;
        }
      }
      else {
        bVar7 = LineSplitter::match_start(splitter,"Faces");
        if (bVar7) {
          pcVar10 = LineSplitter::operator[](splitter,1);
          uVar13 = 0;
          uVar8 = strtoul10(pcVar10,(char **)0x0);
          std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::reserve
                    ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)local_58,
                     (ulong)uVar8);
          local_64 = uVar8;
          while (((uint)uVar13 != uVar8 &&
                 (pLVar11 = LineSplitter::operator++(splitter),
                 *(int *)&pLVar11->mStream->end != *(int *)&pLVar11->mStream->current))) {
            bVar7 = LineSplitter::match_start(splitter,"Hole");
            if (bVar7) {
              this_02 = DefaultLogger::get();
              Logger::warn(this_02,"Skipping unsupported `Hole` line");
            }
            else {
              bVar7 = LineSplitter::match_start(splitter,"Face");
              if (!bVar7) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&s_1,"Expected Face line",(allocator<char> *)&s);
                ThrowException((string *)&s_1);
              }
              auStack_90._8_8_ = (pointer)0x0;
              auStack_90._16_8_ = (pointer)0x0;
              s_1 = (char *)0x0;
              auStack_90._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_38 = uVar13;
              std::vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_>::
              emplace_back<Assimp::COB::Face>
                        ((vector<Assimp::COB::Face,_std::allocator<Assimp::COB::Face>_> *)local_58,
                         (Face *)&s_1);
              std::_Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
              ::~_Vector_base((_Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                               *)auStack_90);
              ppNVar4 = local_60[1].temp_children.
                        super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first;
              this_00 = (vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                         *)(ppNVar4 + -3);
              pcVar10 = LineSplitter::operator[](splitter,2);
              uVar8 = strtoul10(pcVar10,(char **)0x0);
              std::vector<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>::
              resize(this_00,(ulong)uVar8);
              pcVar10 = LineSplitter::operator[](splitter,4);
              uVar8 = strtoul10(pcVar10,(char **)0x0);
              *(uint *)((long)ppNVar4 + -0x1c) = uVar8;
              pcVar10 = LineSplitter::operator[](splitter,6);
              uVar8 = strtoul10(pcVar10,(char **)0x0);
              *(uint *)(ppNVar4 + -4) = uVar8;
              pLVar11 = LineSplitter::operator++(splitter);
              uVar15 = 0;
              s = (pLVar11->mCur)._M_dataplus._M_p;
              while (uVar13 = local_38, uVar8 = local_64,
                    uVar15 < (ulong)((long)ppNVar4[-2] - (long)ppNVar4[-3] >> 3)) {
                bVar7 = SkipSpaces<char>(&s);
                if (!bVar7) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&s_1,"Expected EOL token in Face entry",&local_99);
                  ThrowException((string *)&s_1);
                }
                pcVar10 = s + 1;
                if (*s != '<') {
                  s = pcVar10;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&s_1,"Expected < token in Face entry",&local_99);
                  ThrowException((string *)&s_1);
                }
                s = pcVar10;
                uVar8 = strtoul10(pcVar10,&s);
                (this_00->
                super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar15].pos_idx = uVar8;
                pcVar10 = s + 1;
                if (*s != ',') {
                  s = pcVar10;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&s_1,"Expected , token in Face entry",&local_99);
                  ThrowException((string *)&s_1);
                }
                s = pcVar10;
                uVar8 = strtoul10(pcVar10,&s);
                (this_00->
                super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar15].uv_idx = uVar8;
                pcVar10 = s + 1;
                uVar15 = uVar15 + 1;
                cVar1 = *s;
                s = pcVar10;
                if (cVar1 != '>') {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&s_1,"Expected < token in Face entry",&local_99);
                  ThrowException((string *)&s_1);
                }
              }
            }
            uVar13 = (ulong)((int)uVar13 + 1);
          }
          if (local_40->version < 5) {
            return;
          }
        }
        else {
          bVar7 = LineSplitter::match_start(splitter,"DrawFlags");
          if (bVar7) {
            pcVar10 = LineSplitter::operator[](splitter,1);
            uVar8 = strtoul10(pcVar10,(char **)0x0);
            *(uint *)&local_60[1].temp_children.
                      super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node = uVar8;
            return;
          }
        }
      }
    }
    LineSplitter::operator++(splitter);
  } while( true );
}

Assistant:

void COBImporter::ReadPolH_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"PolH");
    }

    out.nodes.push_back(std::shared_ptr<Mesh>(new Mesh()));
    Mesh& msh = (Mesh&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Ascii(msh,++splitter,nfo);

    // the chunk has a fixed order of components, but some are not interesting of us so
    // we're just looking for keywords in arbitrary order. The end of the chunk is
    // either the last `Face` or the `DrawFlags` attribute, depending on the format ver.
    for(;splitter;++splitter) {
        if (splitter.match_start("World Vertices")) {
            const unsigned int cnt = strtoul10(splitter[2]);
            msh.vertex_positions.resize(cnt);

            for(unsigned int cur = 0;cur < cnt && ++splitter;++cur) {
                const char* s = splitter->c_str();

                aiVector3D& v = msh.vertex_positions[cur];

                SkipSpaces(&s);
                v.x = fast_atof(&s);
                SkipSpaces(&s);
                v.y = fast_atof(&s);
                SkipSpaces(&s);
                v.z = fast_atof(&s);
            }
        }
        else if (splitter.match_start("Texture Vertices")) {
            const unsigned int cnt = strtoul10(splitter[2]);
            msh.texture_coords.resize(cnt);

            for(unsigned int cur = 0;cur < cnt && ++splitter;++cur) {
                const char* s = splitter->c_str();

                aiVector2D& v = msh.texture_coords[cur];

                SkipSpaces(&s);
                v.x = fast_atof(&s);
                SkipSpaces(&s);
                v.y = fast_atof(&s);
            }
        }
        else if (splitter.match_start("Faces")) {
            const unsigned int cnt = strtoul10(splitter[1]);
            msh.faces.reserve(cnt);

            for(unsigned int cur = 0; cur < cnt && ++splitter ;++cur) {
                if (splitter.match_start("Hole")) {
                    ASSIMP_LOG_WARN( "Skipping unsupported `Hole` line" );
                    continue;
                }

                if (!splitter.match_start("Face")) {
                    ThrowException("Expected Face line");
                }

                msh.faces.push_back(Face());
                Face& face = msh.faces.back();

                face.indices.resize(strtoul10(splitter[2]));
                face.flags = strtoul10(splitter[4]);
                face.material = strtoul10(splitter[6]);

                const char* s = (++splitter)->c_str();
                for(size_t i = 0; i < face.indices.size(); ++i) {
                    if(!SkipSpaces(&s)) {
                        ThrowException("Expected EOL token in Face entry");
                    }
                    if ('<' != *s++) {
                        ThrowException("Expected < token in Face entry");
                    }
                    face.indices[i].pos_idx = strtoul10(s,&s);
                    if (',' != *s++) {
                        ThrowException("Expected , token in Face entry");
                    }
                    face.indices[i].uv_idx = strtoul10(s,&s);
                    if ('>' != *s++) {
                        ThrowException("Expected < token in Face entry");
                    }
                }
            }
            if (nfo.version <= 4) {
                break;
            }
        }
        else if (splitter.match_start("DrawFlags")) {
            msh.draw_flags = strtoul10(splitter[1]);
            break;
        }
    }
}